

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O0

TestCaseGroup * vkt::compute::createBasicComputeShaderTests(TestContext *testCtx)

{
  undefined8 uVar1;
  TestCaseGroup *pTVar2;
  TestNode *pTVar3;
  BufferToBufferInvertTest *pBVar4;
  InvertSSBOInPlaceTest *pIVar5;
  WriteToMultipleSSBOTest *pWVar6;
  SSBOLocalBarrierTest *pSVar7;
  SSBOBarrierTest *pSVar8;
  SharedVarTest *pSVar9;
  SharedVarAtomicOpTest *pSVar10;
  CopyImageToSSBOTest *pCVar11;
  CopySSBOToImageTest *pCVar12;
  ImageAtomicOpTest *pIVar13;
  ImageBarrierTest *pIVar14;
  Vector<int,_2> local_eac;
  allocator<char> local_ea1;
  string local_ea0;
  allocator<char> local_e79;
  string local_e78;
  undefined1 local_e55;
  Vector<int,_2> local_e54;
  allocator<char> local_e49;
  string local_e48;
  allocator<char> local_e21;
  string local_e20;
  undefined1 local_dfd;
  Vector<int,_2> local_dfc;
  allocator<char> local_df1;
  string local_df0;
  allocator<char> local_dc9;
  string local_dc8;
  undefined1 local_da5;
  Vector<int,_2> local_da4;
  allocator<char> local_d99;
  string local_d98;
  allocator<char> local_d71;
  string local_d70;
  undefined1 local_d4d;
  Vector<int,_2> local_d4c;
  Vector<int,_2> local_d44;
  allocator<char> local_d39;
  string local_d38;
  allocator<char> local_d11;
  string local_d10;
  undefined1 local_ced;
  Vector<int,_2> local_cec;
  Vector<int,_2> local_ce4;
  allocator<char> local_cd9;
  string local_cd8;
  allocator<char> local_cb1;
  string local_cb0;
  undefined1 local_c8d;
  Vector<int,_2> local_c8c;
  Vector<int,_2> local_c84;
  allocator<char> local_c79;
  string local_c78;
  allocator<char> local_c51;
  string local_c50;
  undefined1 local_c2d;
  Vector<int,_2> local_c2c;
  Vector<int,_2> local_c24;
  allocator<char> local_c19;
  string local_c18;
  allocator<char> local_bf1;
  string local_bf0;
  undefined1 local_bcd;
  Vector<int,_3> local_bcc;
  Vector<int,_3> local_bc0;
  allocator<char> local_bb1;
  string local_bb0;
  allocator<char> local_b89;
  string local_b88;
  undefined1 local_b65;
  Vector<int,_3> local_b64;
  Vector<int,_3> local_b58;
  allocator<char> local_b49;
  string local_b48;
  allocator<char> local_b21;
  string local_b20;
  undefined1 local_afd;
  Vector<int,_3> local_afc;
  Vector<int,_3> local_af0;
  allocator<char> local_ae1;
  string local_ae0;
  allocator<char> local_ab9;
  string local_ab8;
  undefined1 local_a95;
  Vector<int,_3> local_a94;
  Vector<int,_3> local_a88;
  allocator<char> local_a79;
  string local_a78;
  allocator<char> local_a51;
  string local_a50;
  undefined1 local_a2d;
  Vector<int,_3> local_a2c;
  Vector<int,_3> local_a20;
  allocator<char> local_a11;
  string local_a10;
  allocator<char> local_9e9;
  string local_9e8;
  undefined1 local_9c5;
  Vector<int,_3> local_9c4;
  Vector<int,_3> local_9b8;
  allocator<char> local_9a9;
  string local_9a8;
  allocator<char> local_981;
  string local_980;
  undefined1 local_95d;
  Vector<int,_3> local_95c;
  Vector<int,_3> local_950;
  allocator<char> local_941;
  string local_940;
  allocator<char> local_919;
  string local_918;
  undefined1 local_8f5;
  Vector<int,_3> local_8f4;
  Vector<int,_3> local_8e8;
  allocator<char> local_8d9;
  string local_8d8;
  allocator<char> local_8b1;
  string local_8b0;
  undefined1 local_889;
  Vector<int,_3> local_888;
  allocator<char> local_879;
  string local_878;
  allocator<char> local_851;
  string local_850;
  undefined1 local_829;
  Vector<int,_3> local_828;
  allocator<char> local_819;
  string local_818;
  allocator<char> local_7f1;
  string local_7f0;
  undefined1 local_7cd;
  Vector<int,_3> local_7cc;
  Vector<int,_3> local_7c0;
  allocator<char> local_7b1;
  string local_7b0;
  allocator<char> local_789;
  string local_788;
  undefined1 local_765;
  Vector<int,_3> local_764;
  Vector<int,_3> local_758;
  allocator<char> local_749;
  string local_748;
  allocator<char> local_721;
  string local_720;
  undefined1 local_6fd;
  Vector<int,_3> local_6fc;
  Vector<int,_3> local_6f0;
  allocator<char> local_6e1;
  string local_6e0;
  allocator<char> local_6b9;
  string local_6b8;
  undefined1 local_695;
  Vector<int,_3> local_694;
  Vector<int,_3> local_688;
  allocator<char> local_679;
  string local_678;
  allocator<char> local_651;
  string local_650;
  undefined1 local_62d;
  Vector<int,_3> local_62c;
  Vector<int,_3> local_620;
  allocator<char> local_611;
  string local_610;
  allocator<char> local_5e9;
  string local_5e8;
  undefined1 local_5c5;
  Vector<int,_3> local_5c4;
  Vector<int,_3> local_5b8;
  allocator<char> local_5a9;
  string local_5a8;
  allocator<char> local_581;
  string local_580;
  undefined1 local_55d;
  Vector<int,_3> local_55c;
  Vector<int,_3> local_550;
  allocator<char> local_541;
  string local_540;
  allocator<char> local_519;
  string local_518;
  undefined1 local_4f5;
  Vector<int,_3> local_4f4;
  Vector<int,_3> local_4e8;
  allocator<char> local_4d9;
  string local_4d8;
  allocator<char> local_4b1;
  string local_4b0;
  undefined1 local_48d;
  Vector<int,_3> local_48c;
  Vector<int,_3> local_480;
  allocator<char> local_471;
  string local_470;
  allocator<char> local_449;
  string local_448;
  undefined1 local_425;
  Vector<int,_3> local_424;
  Vector<int,_3> local_418;
  allocator<char> local_409;
  string local_408;
  allocator<char> local_3e1;
  string local_3e0;
  undefined1 local_3bd;
  Vector<int,_3> local_3bc;
  Vector<int,_3> local_3b0;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  Vector<int,_3> local_354;
  Vector<int,_3> local_348;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  Vector<int,_3> local_2ec;
  Vector<int,_3> local_2e0;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  Vector<int,_3> local_284;
  Vector<int,_3> local_278;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  Vector<int,_3> local_21c;
  Vector<int,_3> local_210;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  Vector<int,_3> local_1b4;
  Vector<int,_3> local_1a8;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  Vector<int,_3> local_14c;
  Vector<int,_3> local_140;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  Vector<int,_3> local_e4;
  Vector<int,_3> local_d8;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_51;
  string local_50;
  DefaultDeleter<tcu::TestCaseGroup> local_2d [13];
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> basicComputeTests;
  TestContext *testCtx_local;
  
  basicComputeTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data._8_8_ = testCtx;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)
                    basicComputeTests.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"basic","Basic compute tests");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(local_2d);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20,pTVar2
            );
  pTVar2 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::get
                     ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"empty_shader",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Shader that does nothing",&local_79);
  addFunctionCaseWithPrograms
            (pTVar2,&local_50,&local_78,anon_unknown_0::EmptyShaderTest::createProgram,
             anon_unknown_0::EmptyShaderTest::createTest);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"ubo_to_ssbo_single_invocation",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"Copy from UBO to SSBO, inverting bits",&local_c9);
  tcu::Vector<int,_3>::Vector(&local_d8,1,1,1);
  tcu::Vector<int,_3>::Vector(&local_e4,1,1,1);
  pBVar4 = anon_unknown_0::BufferToBufferInvertTest::UBOToSSBOInvertCase
                     ((TestContext *)uVar1,&local_a0,&local_c8,0x100,&local_d8,&local_e4);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"ubo_to_ssbo_single_group",&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"Copy from UBO to SSBO, inverting bits",&local_131);
  tcu::Vector<int,_3>::Vector(&local_140,2,1,4);
  tcu::Vector<int,_3>::Vector(&local_14c,1,1,1);
  pBVar4 = anon_unknown_0::BufferToBufferInvertTest::UBOToSSBOInvertCase
                     ((TestContext *)uVar1,&local_108,&local_130,0x400,&local_140,&local_14c);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"ubo_to_ssbo_multiple_invocations",&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"Copy from UBO to SSBO, inverting bits",&local_199);
  tcu::Vector<int,_3>::Vector(&local_1a8,1,1,1);
  tcu::Vector<int,_3>::Vector(&local_1b4,2,4,1);
  pBVar4 = anon_unknown_0::BufferToBufferInvertTest::UBOToSSBOInvertCase
                     ((TestContext *)uVar1,&local_170,&local_198,0x400,&local_1a8,&local_1b4);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"ubo_to_ssbo_multiple_groups",&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"Copy from UBO to SSBO, inverting bits",&local_201);
  tcu::Vector<int,_3>::Vector(&local_210,1,4,2);
  tcu::Vector<int,_3>::Vector(&local_21c,2,2,4);
  pBVar4 = anon_unknown_0::BufferToBufferInvertTest::UBOToSSBOInvertCase
                     ((TestContext *)uVar1,&local_1d8,&local_200,0x400,&local_210,&local_21c);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"copy_ssbo_single_invocation",&local_241);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"Copy between SSBOs, inverting bits",&local_269);
  tcu::Vector<int,_3>::Vector(&local_278,1,1,1);
  tcu::Vector<int,_3>::Vector(&local_284,1,1,1);
  pBVar4 = anon_unknown_0::BufferToBufferInvertTest::CopyInvertSSBOCase
                     ((TestContext *)uVar1,&local_240,&local_268,0x100,&local_278,&local_284);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator(&local_241);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"copy_ssbo_multiple_invocations",&local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"Copy between SSBOs, inverting bits",&local_2d1);
  tcu::Vector<int,_3>::Vector(&local_2e0,1,1,1);
  tcu::Vector<int,_3>::Vector(&local_2ec,2,4,1);
  pBVar4 = anon_unknown_0::BufferToBufferInvertTest::CopyInvertSSBOCase
                     ((TestContext *)uVar1,&local_2a8,&local_2d0,0x400,&local_2e0,&local_2ec);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"copy_ssbo_multiple_groups",&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"Copy between SSBOs, inverting bits",&local_339);
  tcu::Vector<int,_3>::Vector(&local_348,1,4,2);
  tcu::Vector<int,_3>::Vector(&local_354,2,2,4);
  pBVar4 = anon_unknown_0::BufferToBufferInvertTest::CopyInvertSSBOCase
                     ((TestContext *)uVar1,&local_310,&local_338,0x400,&local_348,&local_354);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pIVar5 = (InvertSSBOInPlaceTest *)operator_new(0x90);
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  local_3bd = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"ssbo_rw_single_invocation",&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a0,"Read and write same SSBO",&local_3a1);
  tcu::Vector<int,_3>::Vector(&local_3b0,1,1,1);
  tcu::Vector<int,_3>::Vector(&local_3bc,1,1,1);
  anon_unknown_0::InvertSSBOInPlaceTest::InvertSSBOInPlaceTest
            (pIVar5,(TestContext *)uVar1,&local_378,&local_3a0,0x100,true,&local_3b0,&local_3bc);
  local_3bd = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar5);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pIVar5 = (InvertSSBOInPlaceTest *)operator_new(0x90);
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  local_425 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e0,"ssbo_rw_multiple_groups",&local_3e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_408,"Read and write same SSBO",&local_409);
  tcu::Vector<int,_3>::Vector(&local_418,1,4,2);
  tcu::Vector<int,_3>::Vector(&local_424,2,2,4);
  anon_unknown_0::InvertSSBOInPlaceTest::InvertSSBOInPlaceTest
            (pIVar5,(TestContext *)uVar1,&local_3e0,&local_408,0x400,true,&local_418,&local_424);
  local_425 = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar5);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pIVar5 = (InvertSSBOInPlaceTest *)operator_new(0x90);
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  local_48d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_448,"ssbo_unsized_arr_single_invocation",&local_449);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"Read and write same SSBO",&local_471);
  tcu::Vector<int,_3>::Vector(&local_480,1,1,1);
  tcu::Vector<int,_3>::Vector(&local_48c,1,1,1);
  anon_unknown_0::InvertSSBOInPlaceTest::InvertSSBOInPlaceTest
            (pIVar5,(TestContext *)uVar1,&local_448,&local_470,0x100,false,&local_480,&local_48c);
  local_48d = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar5);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator(&local_471);
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator(&local_449);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pIVar5 = (InvertSSBOInPlaceTest *)operator_new(0x90);
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  local_4f5 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b0,"ssbo_unsized_arr_multiple_groups",&local_4b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d8,"Read and write same SSBO",&local_4d9);
  tcu::Vector<int,_3>::Vector(&local_4e8,1,4,2);
  tcu::Vector<int,_3>::Vector(&local_4f4,2,2,4);
  anon_unknown_0::InvertSSBOInPlaceTest::InvertSSBOInPlaceTest
            (pIVar5,(TestContext *)uVar1,&local_4b0,&local_4d8,0x400,false,&local_4e8,&local_4f4);
  local_4f5 = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar5);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::allocator<char>::~allocator(&local_4b1);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pWVar6 = (WriteToMultipleSSBOTest *)operator_new(0x90);
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  local_55d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_518,"write_multiple_arr_single_invocation",&local_519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_540,"Write to multiple SSBOs",&local_541);
  tcu::Vector<int,_3>::Vector(&local_550,1,1,1);
  tcu::Vector<int,_3>::Vector(&local_55c,1,1,1);
  anon_unknown_0::WriteToMultipleSSBOTest::WriteToMultipleSSBOTest
            (pWVar6,(TestContext *)uVar1,&local_518,&local_540,0x100,true,&local_550,&local_55c);
  local_55d = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pWVar6);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator(&local_541);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator(&local_519);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pWVar6 = (WriteToMultipleSSBOTest *)operator_new(0x90);
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  local_5c5 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_580,"write_multiple_arr_multiple_groups",&local_581);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a8,"Write to multiple SSBOs",&local_5a9);
  tcu::Vector<int,_3>::Vector(&local_5b8,1,4,2);
  tcu::Vector<int,_3>::Vector(&local_5c4,2,2,4);
  anon_unknown_0::WriteToMultipleSSBOTest::WriteToMultipleSSBOTest
            (pWVar6,(TestContext *)uVar1,&local_580,&local_5a8,0x400,true,&local_5b8,&local_5c4);
  local_5c5 = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pWVar6);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator(&local_5a9);
  std::__cxx11::string::~string((string *)&local_580);
  std::allocator<char>::~allocator(&local_581);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pWVar6 = (WriteToMultipleSSBOTest *)operator_new(0x90);
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  local_62d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e8,"write_multiple_unsized_arr_single_invocation",&local_5e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_610,"Write to multiple SSBOs",&local_611);
  tcu::Vector<int,_3>::Vector(&local_620,1,1,1);
  tcu::Vector<int,_3>::Vector(&local_62c,1,1,1);
  anon_unknown_0::WriteToMultipleSSBOTest::WriteToMultipleSSBOTest
            (pWVar6,(TestContext *)uVar1,&local_5e8,&local_610,0x100,false,&local_620,&local_62c);
  local_62d = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pWVar6);
  std::__cxx11::string::~string((string *)&local_610);
  std::allocator<char>::~allocator(&local_611);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::allocator<char>::~allocator(&local_5e9);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pWVar6 = (WriteToMultipleSSBOTest *)operator_new(0x90);
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  local_695 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_650,"write_multiple_unsized_arr_multiple_groups",&local_651);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_678,"Write to multiple SSBOs",&local_679);
  tcu::Vector<int,_3>::Vector(&local_688,1,4,2);
  tcu::Vector<int,_3>::Vector(&local_694,2,2,4);
  anon_unknown_0::WriteToMultipleSSBOTest::WriteToMultipleSSBOTest
            (pWVar6,(TestContext *)uVar1,&local_650,&local_678,0x400,false,&local_688,&local_694);
  local_695 = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pWVar6);
  std::__cxx11::string::~string((string *)&local_678);
  std::allocator<char>::~allocator(&local_679);
  std::__cxx11::string::~string((string *)&local_650);
  std::allocator<char>::~allocator(&local_651);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pSVar7 = (SSBOLocalBarrierTest *)operator_new(0x88);
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  local_6fd = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b8,"ssbo_local_barrier_single_invocation",&local_6b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e0,"SSBO local barrier usage",&local_6e1);
  tcu::Vector<int,_3>::Vector(&local_6f0,1,1,1);
  tcu::Vector<int,_3>::Vector(&local_6fc,1,1,1);
  anon_unknown_0::SSBOLocalBarrierTest::SSBOLocalBarrierTest
            (pSVar7,(TestContext *)uVar1,&local_6b8,&local_6e0,&local_6f0,&local_6fc);
  local_6fd = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pSVar7);
  std::__cxx11::string::~string((string *)&local_6e0);
  std::allocator<char>::~allocator(&local_6e1);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::allocator<char>::~allocator(&local_6b9);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pSVar7 = (SSBOLocalBarrierTest *)operator_new(0x88);
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  local_765 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_720,"ssbo_local_barrier_single_group",&local_721);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_748,"SSBO local barrier usage",&local_749);
  tcu::Vector<int,_3>::Vector(&local_758,3,2,5);
  tcu::Vector<int,_3>::Vector(&local_764,1,1,1);
  anon_unknown_0::SSBOLocalBarrierTest::SSBOLocalBarrierTest
            (pSVar7,(TestContext *)uVar1,&local_720,&local_748,&local_758,&local_764);
  local_765 = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pSVar7);
  std::__cxx11::string::~string((string *)&local_748);
  std::allocator<char>::~allocator(&local_749);
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator(&local_721);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pSVar7 = (SSBOLocalBarrierTest *)operator_new(0x88);
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  local_7cd = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_788,"ssbo_local_barrier_multiple_groups",&local_789);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7b0,"SSBO local barrier usage",&local_7b1);
  tcu::Vector<int,_3>::Vector(&local_7c0,3,4,1);
  tcu::Vector<int,_3>::Vector(&local_7cc,2,7,3);
  anon_unknown_0::SSBOLocalBarrierTest::SSBOLocalBarrierTest
            (pSVar7,(TestContext *)uVar1,&local_788,&local_7b0,&local_7c0,&local_7cc);
  local_7cd = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pSVar7);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::allocator<char>::~allocator(&local_7b1);
  std::__cxx11::string::~string((string *)&local_788);
  std::allocator<char>::~allocator(&local_789);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pSVar8 = (SSBOBarrierTest *)operator_new(0x80);
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  local_829 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7f0,"ssbo_cmd_barrier_single",&local_7f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_818,"SSBO memory barrier usage",&local_819);
  tcu::Vector<int,_3>::Vector(&local_828,1,1,1);
  anon_unknown_0::SSBOBarrierTest::SSBOBarrierTest
            (pSVar8,(TestContext *)uVar1,&local_7f0,&local_818,&local_828);
  local_829 = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pSVar8);
  std::__cxx11::string::~string((string *)&local_818);
  std::allocator<char>::~allocator(&local_819);
  std::__cxx11::string::~string((string *)&local_7f0);
  std::allocator<char>::~allocator(&local_7f1);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pSVar8 = (SSBOBarrierTest *)operator_new(0x80);
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  local_889 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_850,"ssbo_cmd_barrier_multiple",&local_851);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_878,"SSBO memory barrier usage",&local_879);
  tcu::Vector<int,_3>::Vector(&local_888,0xb,5,7);
  anon_unknown_0::SSBOBarrierTest::SSBOBarrierTest
            (pSVar8,(TestContext *)uVar1,&local_850,&local_878,&local_888);
  local_889 = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pSVar8);
  std::__cxx11::string::~string((string *)&local_878);
  std::allocator<char>::~allocator(&local_879);
  std::__cxx11::string::~string((string *)&local_850);
  std::allocator<char>::~allocator(&local_851);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pSVar9 = (SharedVarTest *)operator_new(0x88);
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  local_8f5 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8b0,"shared_var_single_invocation",&local_8b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8d8,"Basic shared variable usage",&local_8d9);
  tcu::Vector<int,_3>::Vector(&local_8e8,1,1,1);
  tcu::Vector<int,_3>::Vector(&local_8f4,1,1,1);
  anon_unknown_0::SharedVarTest::SharedVarTest
            (pSVar9,(TestContext *)uVar1,&local_8b0,&local_8d8,&local_8e8,&local_8f4);
  local_8f5 = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pSVar9);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::allocator<char>::~allocator(&local_8d9);
  std::__cxx11::string::~string((string *)&local_8b0);
  std::allocator<char>::~allocator(&local_8b1);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pSVar9 = (SharedVarTest *)operator_new(0x88);
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  local_95d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_918,"shared_var_single_group",&local_919);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_940,"Basic shared variable usage",&local_941);
  tcu::Vector<int,_3>::Vector(&local_950,3,2,5);
  tcu::Vector<int,_3>::Vector(&local_95c,1,1,1);
  anon_unknown_0::SharedVarTest::SharedVarTest
            (pSVar9,(TestContext *)uVar1,&local_918,&local_940,&local_950,&local_95c);
  local_95d = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pSVar9);
  std::__cxx11::string::~string((string *)&local_940);
  std::allocator<char>::~allocator(&local_941);
  std::__cxx11::string::~string((string *)&local_918);
  std::allocator<char>::~allocator(&local_919);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pSVar9 = (SharedVarTest *)operator_new(0x88);
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  local_9c5 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_980,"shared_var_multiple_invocations",&local_981);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9a8,"Basic shared variable usage",&local_9a9);
  tcu::Vector<int,_3>::Vector(&local_9b8,1,1,1);
  tcu::Vector<int,_3>::Vector(&local_9c4,2,5,4);
  anon_unknown_0::SharedVarTest::SharedVarTest
            (pSVar9,(TestContext *)uVar1,&local_980,&local_9a8,&local_9b8,&local_9c4);
  local_9c5 = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pSVar9);
  std::__cxx11::string::~string((string *)&local_9a8);
  std::allocator<char>::~allocator(&local_9a9);
  std::__cxx11::string::~string((string *)&local_980);
  std::allocator<char>::~allocator(&local_981);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pSVar9 = (SharedVarTest *)operator_new(0x88);
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  local_a2d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9e8,"shared_var_multiple_groups",&local_9e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a10,"Basic shared variable usage",&local_a11);
  tcu::Vector<int,_3>::Vector(&local_a20,3,4,1);
  tcu::Vector<int,_3>::Vector(&local_a2c,2,7,3);
  anon_unknown_0::SharedVarTest::SharedVarTest
            (pSVar9,(TestContext *)uVar1,&local_9e8,&local_a10,&local_a20,&local_a2c);
  local_a2d = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pSVar9);
  std::__cxx11::string::~string((string *)&local_a10);
  std::allocator<char>::~allocator(&local_a11);
  std::__cxx11::string::~string((string *)&local_9e8);
  std::allocator<char>::~allocator(&local_9e9);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pSVar10 = (SharedVarAtomicOpTest *)operator_new(0x88);
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  local_a95 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a50,"shared_atomic_op_single_invocation",&local_a51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a78,"Atomic operation with shared var",&local_a79);
  tcu::Vector<int,_3>::Vector(&local_a88,1,1,1);
  tcu::Vector<int,_3>::Vector(&local_a94,1,1,1);
  anon_unknown_0::SharedVarAtomicOpTest::SharedVarAtomicOpTest
            (pSVar10,(TestContext *)uVar1,&local_a50,&local_a78,&local_a88,&local_a94);
  local_a95 = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pSVar10);
  std::__cxx11::string::~string((string *)&local_a78);
  std::allocator<char>::~allocator(&local_a79);
  std::__cxx11::string::~string((string *)&local_a50);
  std::allocator<char>::~allocator(&local_a51);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pSVar10 = (SharedVarAtomicOpTest *)operator_new(0x88);
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  local_afd = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ab8,"shared_atomic_op_single_group",&local_ab9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ae0,"Atomic operation with shared var",&local_ae1);
  tcu::Vector<int,_3>::Vector(&local_af0,3,2,5);
  tcu::Vector<int,_3>::Vector(&local_afc,1,1,1);
  anon_unknown_0::SharedVarAtomicOpTest::SharedVarAtomicOpTest
            (pSVar10,(TestContext *)uVar1,&local_ab8,&local_ae0,&local_af0,&local_afc);
  local_afd = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pSVar10);
  std::__cxx11::string::~string((string *)&local_ae0);
  std::allocator<char>::~allocator(&local_ae1);
  std::__cxx11::string::~string((string *)&local_ab8);
  std::allocator<char>::~allocator(&local_ab9);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pSVar10 = (SharedVarAtomicOpTest *)operator_new(0x88);
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  local_b65 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b20,"shared_atomic_op_multiple_invocations",&local_b21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b48,"Atomic operation with shared var",&local_b49);
  tcu::Vector<int,_3>::Vector(&local_b58,1,1,1);
  tcu::Vector<int,_3>::Vector(&local_b64,2,5,4);
  anon_unknown_0::SharedVarAtomicOpTest::SharedVarAtomicOpTest
            (pSVar10,(TestContext *)uVar1,&local_b20,&local_b48,&local_b58,&local_b64);
  local_b65 = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pSVar10);
  std::__cxx11::string::~string((string *)&local_b48);
  std::allocator<char>::~allocator(&local_b49);
  std::__cxx11::string::~string((string *)&local_b20);
  std::allocator<char>::~allocator(&local_b21);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pSVar10 = (SharedVarAtomicOpTest *)operator_new(0x88);
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  local_bcd = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b88,"shared_atomic_op_multiple_groups",&local_b89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bb0,"Atomic operation with shared var",&local_bb1);
  tcu::Vector<int,_3>::Vector(&local_bc0,3,4,1);
  tcu::Vector<int,_3>::Vector(&local_bcc,2,7,3);
  anon_unknown_0::SharedVarAtomicOpTest::SharedVarAtomicOpTest
            (pSVar10,(TestContext *)uVar1,&local_b88,&local_bb0,&local_bc0,&local_bcc);
  local_bcd = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pSVar10);
  std::__cxx11::string::~string((string *)&local_bb0);
  std::allocator<char>::~allocator(&local_bb1);
  std::__cxx11::string::~string((string *)&local_b88);
  std::allocator<char>::~allocator(&local_b89);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pCVar11 = (CopyImageToSSBOTest *)operator_new(0x80);
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  local_c2d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bf0,"copy_image_to_ssbo_small",&local_bf1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c18,"Image to SSBO copy",&local_c19);
  tcu::Vector<int,_2>::Vector(&local_c24,1,1);
  tcu::Vector<int,_2>::Vector(&local_c2c,0x40,0x40);
  anon_unknown_0::CopyImageToSSBOTest::CopyImageToSSBOTest
            (pCVar11,(TestContext *)uVar1,&local_bf0,&local_c18,&local_c24,&local_c2c);
  local_c2d = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pCVar11);
  std::__cxx11::string::~string((string *)&local_c18);
  std::allocator<char>::~allocator(&local_c19);
  std::__cxx11::string::~string((string *)&local_bf0);
  std::allocator<char>::~allocator(&local_bf1);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pCVar11 = (CopyImageToSSBOTest *)operator_new(0x80);
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  local_c8d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c50,"copy_image_to_ssbo_large",&local_c51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c78,"Image to SSBO copy",&local_c79);
  tcu::Vector<int,_2>::Vector(&local_c84,2,4);
  tcu::Vector<int,_2>::Vector(&local_c8c,0x200,0x200);
  anon_unknown_0::CopyImageToSSBOTest::CopyImageToSSBOTest
            (pCVar11,(TestContext *)uVar1,&local_c50,&local_c78,&local_c84,&local_c8c);
  local_c8d = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pCVar11);
  std::__cxx11::string::~string((string *)&local_c78);
  std::allocator<char>::~allocator(&local_c79);
  std::__cxx11::string::~string((string *)&local_c50);
  std::allocator<char>::~allocator(&local_c51);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pCVar12 = (CopySSBOToImageTest *)operator_new(0x80);
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  local_ced = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_cb0,"copy_ssbo_to_image_small",&local_cb1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_cd8,"SSBO to image copy",&local_cd9);
  tcu::Vector<int,_2>::Vector(&local_ce4,1,1);
  tcu::Vector<int,_2>::Vector(&local_cec,0x40,0x40);
  anon_unknown_0::CopySSBOToImageTest::CopySSBOToImageTest
            (pCVar12,(TestContext *)uVar1,&local_cb0,&local_cd8,&local_ce4,&local_cec);
  local_ced = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pCVar12);
  std::__cxx11::string::~string((string *)&local_cd8);
  std::allocator<char>::~allocator(&local_cd9);
  std::__cxx11::string::~string((string *)&local_cb0);
  std::allocator<char>::~allocator(&local_cb1);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pCVar12 = (CopySSBOToImageTest *)operator_new(0x80);
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  local_d4d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d10,"copy_ssbo_to_image_large",&local_d11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d38,"SSBO to image copy",&local_d39);
  tcu::Vector<int,_2>::Vector(&local_d44,2,4);
  tcu::Vector<int,_2>::Vector(&local_d4c,0x200,0x200);
  anon_unknown_0::CopySSBOToImageTest::CopySSBOToImageTest
            (pCVar12,(TestContext *)uVar1,&local_d10,&local_d38,&local_d44,&local_d4c);
  local_d4d = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pCVar12);
  std::__cxx11::string::~string((string *)&local_d38);
  std::allocator<char>::~allocator(&local_d39);
  std::__cxx11::string::~string((string *)&local_d10);
  std::allocator<char>::~allocator(&local_d11);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pIVar13 = (ImageAtomicOpTest *)operator_new(0x80);
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  local_da5 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d70,"image_atomic_op_local_size_1",&local_d71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d98,"Atomic operation with image",&local_d99);
  tcu::Vector<int,_2>::Vector(&local_da4,0x40,0x40);
  anon_unknown_0::ImageAtomicOpTest::ImageAtomicOpTest
            (pIVar13,(TestContext *)uVar1,&local_d70,&local_d98,1,&local_da4);
  local_da5 = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar13);
  std::__cxx11::string::~string((string *)&local_d98);
  std::allocator<char>::~allocator(&local_d99);
  std::__cxx11::string::~string((string *)&local_d70);
  std::allocator<char>::~allocator(&local_d71);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pIVar13 = (ImageAtomicOpTest *)operator_new(0x80);
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  local_dfd = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_dc8,"image_atomic_op_local_size_8",&local_dc9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_df0,"Atomic operation with image",&local_df1);
  tcu::Vector<int,_2>::Vector(&local_dfc,0x40,0x40);
  anon_unknown_0::ImageAtomicOpTest::ImageAtomicOpTest
            (pIVar13,(TestContext *)uVar1,&local_dc8,&local_df0,8,&local_dfc);
  local_dfd = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar13);
  std::__cxx11::string::~string((string *)&local_df0);
  std::allocator<char>::~allocator(&local_df1);
  std::__cxx11::string::~string((string *)&local_dc8);
  std::allocator<char>::~allocator(&local_dc9);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pIVar14 = (ImageBarrierTest *)operator_new(0x78);
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  local_e55 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e20,"image_barrier_single",&local_e21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e48,"Image barrier",&local_e49);
  tcu::Vector<int,_2>::Vector(&local_e54,1,1);
  anon_unknown_0::ImageBarrierTest::ImageBarrierTest
            (pIVar14,(TestContext *)uVar1,&local_e20,&local_e48,&local_e54);
  local_e55 = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar14);
  std::__cxx11::string::~string((string *)&local_e48);
  std::allocator<char>::~allocator(&local_e49);
  std::__cxx11::string::~string((string *)&local_e20);
  std::allocator<char>::~allocator(&local_e21);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pIVar14 = (ImageBarrierTest *)operator_new(0x78);
  uVar1 = basicComputeTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e78,"image_barrier_multiple",&local_e79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ea0,"Image barrier",&local_ea1);
  tcu::Vector<int,_2>::Vector(&local_eac,0x40,0x40);
  anon_unknown_0::ImageBarrierTest::ImageBarrierTest
            (pIVar14,(TestContext *)uVar1,&local_e78,&local_ea0,&local_eac);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar14);
  std::__cxx11::string::~string((string *)&local_ea0);
  std::allocator<char>::~allocator(&local_ea1);
  std::__cxx11::string::~string((string *)&local_e78);
  std::allocator<char>::~allocator(&local_e79);
  pTVar2 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20)
  ;
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  return pTVar2;
}

Assistant:

tcu::TestCaseGroup* createBasicComputeShaderTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> basicComputeTests(new tcu::TestCaseGroup(testCtx, "basic", "Basic compute tests"));

	addFunctionCaseWithPrograms(basicComputeTests.get(), "empty_shader", "Shader that does nothing", EmptyShaderTest::createProgram, EmptyShaderTest::createTest);

	basicComputeTests->addChild(BufferToBufferInvertTest::UBOToSSBOInvertCase(testCtx,	"ubo_to_ssbo_single_invocation",	"Copy from UBO to SSBO, inverting bits",	256,	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(BufferToBufferInvertTest::UBOToSSBOInvertCase(testCtx,	"ubo_to_ssbo_single_group",			"Copy from UBO to SSBO, inverting bits",	1024,	tcu::IVec3(2,1,4),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(BufferToBufferInvertTest::UBOToSSBOInvertCase(testCtx,	"ubo_to_ssbo_multiple_invocations",	"Copy from UBO to SSBO, inverting bits",	1024,	tcu::IVec3(1,1,1),	tcu::IVec3(2,4,1)));
	basicComputeTests->addChild(BufferToBufferInvertTest::UBOToSSBOInvertCase(testCtx,	"ubo_to_ssbo_multiple_groups",		"Copy from UBO to SSBO, inverting bits",	1024,	tcu::IVec3(1,4,2),	tcu::IVec3(2,2,4)));

	basicComputeTests->addChild(BufferToBufferInvertTest::CopyInvertSSBOCase(testCtx,	"copy_ssbo_single_invocation",		"Copy between SSBOs, inverting bits",	256,	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(BufferToBufferInvertTest::CopyInvertSSBOCase(testCtx,	"copy_ssbo_multiple_invocations",	"Copy between SSBOs, inverting bits",	1024,	tcu::IVec3(1,1,1),	tcu::IVec3(2,4,1)));
	basicComputeTests->addChild(BufferToBufferInvertTest::CopyInvertSSBOCase(testCtx,	"copy_ssbo_multiple_groups",		"Copy between SSBOs, inverting bits",	1024,	tcu::IVec3(1,4,2),	tcu::IVec3(2,2,4)));

	basicComputeTests->addChild(new InvertSSBOInPlaceTest(testCtx,	"ssbo_rw_single_invocation",			"Read and write same SSBO",		256,	true,	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new InvertSSBOInPlaceTest(testCtx,	"ssbo_rw_multiple_groups",				"Read and write same SSBO",		1024,	true,	tcu::IVec3(1,4,2),	tcu::IVec3(2,2,4)));
	basicComputeTests->addChild(new InvertSSBOInPlaceTest(testCtx,	"ssbo_unsized_arr_single_invocation",	"Read and write same SSBO",		256,	false,	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new InvertSSBOInPlaceTest(testCtx,	"ssbo_unsized_arr_multiple_groups",		"Read and write same SSBO",		1024,	false,	tcu::IVec3(1,4,2),	tcu::IVec3(2,2,4)));

	basicComputeTests->addChild(new WriteToMultipleSSBOTest(testCtx,	"write_multiple_arr_single_invocation",			"Write to multiple SSBOs",	256,	true,	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new WriteToMultipleSSBOTest(testCtx,	"write_multiple_arr_multiple_groups",			"Write to multiple SSBOs",	1024,	true,	tcu::IVec3(1,4,2),	tcu::IVec3(2,2,4)));
	basicComputeTests->addChild(new WriteToMultipleSSBOTest(testCtx,	"write_multiple_unsized_arr_single_invocation",	"Write to multiple SSBOs",	256,	false,	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new WriteToMultipleSSBOTest(testCtx,	"write_multiple_unsized_arr_multiple_groups",	"Write to multiple SSBOs",	1024,	false,	tcu::IVec3(1,4,2),	tcu::IVec3(2,2,4)));

	basicComputeTests->addChild(new SSBOLocalBarrierTest(testCtx,	"ssbo_local_barrier_single_invocation",	"SSBO local barrier usage",	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new SSBOLocalBarrierTest(testCtx,	"ssbo_local_barrier_single_group",		"SSBO local barrier usage",	tcu::IVec3(3,2,5),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new SSBOLocalBarrierTest(testCtx,	"ssbo_local_barrier_multiple_groups",	"SSBO local barrier usage",	tcu::IVec3(3,4,1),	tcu::IVec3(2,7,3)));

	basicComputeTests->addChild(new SSBOBarrierTest(testCtx,	"ssbo_cmd_barrier_single",		"SSBO memory barrier usage",	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new SSBOBarrierTest(testCtx,	"ssbo_cmd_barrier_multiple",	"SSBO memory barrier usage",	tcu::IVec3(11,5,7)));

	basicComputeTests->addChild(new SharedVarTest(testCtx,	"shared_var_single_invocation",		"Basic shared variable usage",	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new SharedVarTest(testCtx,	"shared_var_single_group",			"Basic shared variable usage",	tcu::IVec3(3,2,5),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new SharedVarTest(testCtx,	"shared_var_multiple_invocations",	"Basic shared variable usage",	tcu::IVec3(1,1,1),	tcu::IVec3(2,5,4)));
	basicComputeTests->addChild(new SharedVarTest(testCtx,	"shared_var_multiple_groups",		"Basic shared variable usage",	tcu::IVec3(3,4,1),	tcu::IVec3(2,7,3)));

	basicComputeTests->addChild(new SharedVarAtomicOpTest(testCtx,	"shared_atomic_op_single_invocation",		"Atomic operation with shared var",		tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new SharedVarAtomicOpTest(testCtx,	"shared_atomic_op_single_group",			"Atomic operation with shared var",		tcu::IVec3(3,2,5),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new SharedVarAtomicOpTest(testCtx,	"shared_atomic_op_multiple_invocations",	"Atomic operation with shared var",		tcu::IVec3(1,1,1),	tcu::IVec3(2,5,4)));
	basicComputeTests->addChild(new SharedVarAtomicOpTest(testCtx,	"shared_atomic_op_multiple_groups",			"Atomic operation with shared var",		tcu::IVec3(3,4,1),	tcu::IVec3(2,7,3)));

	basicComputeTests->addChild(new CopyImageToSSBOTest(testCtx,	"copy_image_to_ssbo_small",	"Image to SSBO copy",	tcu::IVec2(1,1),	tcu::IVec2(64,64)));
	basicComputeTests->addChild(new CopyImageToSSBOTest(testCtx,	"copy_image_to_ssbo_large",	"Image to SSBO copy",	tcu::IVec2(2,4),	tcu::IVec2(512,512)));

	basicComputeTests->addChild(new CopySSBOToImageTest(testCtx,	"copy_ssbo_to_image_small",	"SSBO to image copy",	tcu::IVec2(1, 1),	tcu::IVec2(64, 64)));
	basicComputeTests->addChild(new CopySSBOToImageTest(testCtx,	"copy_ssbo_to_image_large",	"SSBO to image copy",	tcu::IVec2(2, 4),	tcu::IVec2(512, 512)));

	basicComputeTests->addChild(new ImageAtomicOpTest(testCtx,	"image_atomic_op_local_size_1",	"Atomic operation with image",	1,	tcu::IVec2(64,64)));
	basicComputeTests->addChild(new ImageAtomicOpTest(testCtx,	"image_atomic_op_local_size_8",	"Atomic operation with image",	8,	tcu::IVec2(64,64)));

	basicComputeTests->addChild(new ImageBarrierTest(testCtx,	"image_barrier_single",		"Image barrier",	tcu::IVec2(1,1)));
	basicComputeTests->addChild(new ImageBarrierTest(testCtx,	"image_barrier_multiple",	"Image barrier",	tcu::IVec2(64,64)));

	return basicComputeTests.release();
}